

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

ostream * Diligent::Parsing::WriteToken<Diligent::Parsing::HLSLTokenInfo>
                    (ostream *stream,HLSLTokenInfo *Token)

{
  TokenType TVar1;
  TokenType Type;
  HLSLTokenInfo *Token_local;
  ostream *stream_local;
  
  HLSLTokenInfo::OutputDelimiter(Token,stream);
  TVar1 = HLSLTokenInfo::GetType(Token);
  if (TVar1 == StringConstant) {
    std::operator<<(stream,"\"");
  }
  HLSLTokenInfo::OutputLiteral(Token,stream);
  if (TVar1 == StringConstant) {
    std::operator<<(stream,"\"");
  }
  return stream;
}

Assistant:

std::ostream& WriteToken(std::ostream& stream, const TokenClass& Token)
{
    Token.OutputDelimiter(stream);

    const auto Type = Token.GetType();
    using TokenType = decltype(Type);
    if (Type == TokenType::StringConstant)
        stream << "\"";
    Token.OutputLiteral(stream);
    if (Type == TokenType::StringConstant)
        stream << "\"";

    return stream;
}